

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_reverse(lua_State *L)

{
  char *pcVar1;
  long lVar2;
  char *s;
  luaL_Buffer b;
  size_t l;
  lua_State *L_local;
  
  pcVar1 = luaL_checklstring(L,1,(size_t *)(b.buffer + 0x1ff8));
  luaL_buffinit(L,(luaL_Buffer *)&s);
  while (lVar2 = b.buffer._8184_8_ + -1, b.buffer._8184_8_ != 0) {
    b.buffer._8184_8_ = lVar2;
    if (b.buffer + 0x1ff8 <= s) {
      luaL_prepbuffer((luaL_Buffer *)&s);
    }
    *s = pcVar1[b.buffer._8184_8_];
    s = s + 1;
  }
  b.buffer._8184_8_ = lVar2;
  luaL_pushresult((luaL_Buffer *)&s);
  return 1;
}

Assistant:

static int str_reverse (lua_State *L) {
  size_t l;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  luaL_buffinit(L, &b);
  while (l--) luaL_addchar(&b, s[l]);
  luaL_pushresult(&b);
  return 1;
}